

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnRefFunc(SharedValidator *this,Location *loc,Var *func_var)

{
  Result RVar1;
  Result RVar2;
  Index func_type;
  Enum EVar3;
  char *pcVar4;
  int __c;
  int __c_00;
  int extraout_EDX;
  Var *__s;
  Var *pVVar5;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar6;
  undefined1 local_74 [76];
  
  RVar1 = CheckInstr(this,(Opcode)0xd8,loc);
  pVVar5 = (Var *)(local_74 + 4);
  Var::Var(pVVar5,func_var);
  __s = pVVar5;
  RVar2 = CheckFuncIndex(this,pVVar5,(FuncType *)0x0);
  Var::~Var(pVVar5);
  EVar3 = Error;
  if ((RVar1.enum_ != Error) && (RVar2.enum_ != Error)) {
    if (this->in_init_expr_ == true) {
      pcVar4 = Var::index(func_var,(char *)__s,__c);
      pVVar5 = (Var *)local_74;
      local_74._0_4_ = SUB84(pcVar4,0);
      pVar6 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::_M_insert_unique<unsigned_int>(&(this->declared_funcs_)._M_t,(uint *)pVVar5);
      __c_00 = pVar6._8_4_;
    }
    else {
      pVVar5 = func_var;
      std::vector<wabt::Var,_std::allocator<wabt::Var>_>::push_back
                (&this->check_declared_funcs_,func_var);
      __c_00 = extraout_EDX;
    }
    pcVar4 = Var::index(func_var,(char *)pVVar5,__c_00);
    func_type = GetFunctionTypeIndex(this,(Index)pcVar4);
    RVar1 = TypeChecker::OnRefFuncExpr(&this->typechecker_,func_type);
    EVar3 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::OnRefFunc(const Location& loc, Var func_var) {
  Result result = CheckInstr(Opcode::RefFunc, loc);
  result |= CheckFuncIndex(func_var);
  if (Succeeded(result)) {
    // References in initializer expressions are considered declarations, as
    // opposed to references in function bodies that are considered usages.
    if (in_init_expr_) {
      declared_funcs_.insert(func_var.index());
    } else {
      check_declared_funcs_.push_back(func_var);
    }
    Index func_type = GetFunctionTypeIndex(func_var.index());
    result |= typechecker_.OnRefFuncExpr(func_type);
  }
  return result;
}